

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkLineDeviceComputer.cxx
# Opt level: O0

bool __thiscall
cmLinkLineDeviceComputer::ComputeRequiresDeviceLinking
          (cmLinkLineDeviceComputer *this,cmComputeLinkInformation *cli)

{
  cmGeneratorTarget *pcVar1;
  undefined8 this_00;
  bool bVar2;
  TargetType TVar3;
  bool local_e2;
  allocator<char> local_c1;
  string local_c0;
  allocator<char> local_99;
  string local_98;
  reference local_68;
  Item *item;
  const_iterator __end1;
  const_iterator __begin1;
  ItemVector *__range1;
  string config;
  ItemVector *items;
  cmComputeLinkInformation *cli_local;
  cmLinkLineDeviceComputer *this_local;
  
  config.field_2._8_8_ = cmComputeLinkInformation::GetItems(cli);
  cmComputeLinkInformation::GetConfig_abi_cxx11_((string *)&__range1,cli);
  this_00 = config.field_2._8_8_;
  __end1 = std::
           vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>::
           begin((vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
                  *)config.field_2._8_8_);
  item = (Item *)std::
                 vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
                 ::end((vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
                        *)this_00);
  do {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_cmComputeLinkInformation::Item_*,_std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>_>
                                *)&item);
    if (!bVar2) {
      this_local._7_1_ = false;
LAB_0052650d:
      std::__cxx11::string::~string((string *)&__range1);
      return this_local._7_1_;
    }
    local_68 = __gnu_cxx::
               __normal_iterator<const_cmComputeLinkInformation::Item_*,_std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>_>
               ::operator*(&__end1);
    if ((local_68->Target != (cmGeneratorTarget *)0x0) &&
       (TVar3 = cmGeneratorTarget::GetType(local_68->Target), TVar3 == STATIC_LIBRARY)) {
      pcVar1 = local_68->Target;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_98,"CUDA_RESOLVE_DEVICE_SYMBOLS",&local_99);
      bVar2 = cmGeneratorTarget::GetPropertyAsBool(pcVar1,&local_98);
      local_e2 = false;
      if (!bVar2) {
        pcVar1 = local_68->Target;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_c0,"CUDA_SEPARABLE_COMPILATION",&local_c1);
        local_e2 = cmGeneratorTarget::GetPropertyAsBool(pcVar1,&local_c0);
        std::__cxx11::string::~string((string *)&local_c0);
        std::allocator<char>::~allocator(&local_c1);
      }
      std::__cxx11::string::~string((string *)&local_98);
      std::allocator<char>::~allocator(&local_99);
      if (local_e2 != false) {
        this_local._7_1_ = true;
        goto LAB_0052650d;
      }
    }
    __gnu_cxx::
    __normal_iterator<const_cmComputeLinkInformation::Item_*,_std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

bool cmLinkLineDeviceComputer::ComputeRequiresDeviceLinking(
  cmComputeLinkInformation& cli)
{
  // Determine if this item might requires device linking.
  // For this we only consider targets
  typedef cmComputeLinkInformation::ItemVector ItemVector;
  ItemVector const& items = cli.GetItems();
  std::string config = cli.GetConfig();
  for (auto const& item : items) {
    if (item.Target &&
        item.Target->GetType() == cmStateEnums::STATIC_LIBRARY) {
      if ((!item.Target->GetPropertyAsBool("CUDA_RESOLVE_DEVICE_SYMBOLS")) &&
          item.Target->GetPropertyAsBool("CUDA_SEPARABLE_COMPILATION")) {
        // this dependency requires us to device link it
        return true;
      }
    }
  }
  return false;
}